

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall SleighSymbol::restoreXmlHeader(SleighSymbol *this,Element *el)

{
  long lVar1;
  Element *pEVar2;
  _Ios_Fmtflags _Var3;
  string *psVar4;
  allocator local_399;
  string local_398 [32];
  long local_378;
  istringstream s_1;
  allocator local_1f1;
  string local_1f0 [32];
  long local_1d0;
  istringstream s;
  allocator local_39;
  string local_38 [32];
  Element *local_18;
  Element *el_local;
  SleighSymbol *this_local;
  
  local_18 = el;
  el_local = (Element *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"name",&local_39);
  psVar4 = Element::getAttributeValue(el,(string *)local_38);
  std::__cxx11::string::operator=((string *)&this->name,(string *)psVar4);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pEVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"id",&local_1f1);
  psVar4 = Element::getAttributeValue(pEVar2,(string *)local_1f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&local_1d0,psVar4,8);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  lVar1 = *(long *)(local_1d0 + -0x18);
  _Var3 = std::operator|(_S_dec,_S_hex);
  _Var3 = std::operator|(_Var3,_S_oct);
  std::ios_base::unsetf((ios_base *)((long)&local_1d0 + lVar1),_Var3);
  std::istream::operator>>(&local_1d0,&this->id);
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_1d0);
  pEVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"scope",&local_399);
  psVar4 = Element::getAttributeValue(pEVar2,(string *)local_398);
  std::__cxx11::istringstream::istringstream((istringstream *)&local_378,psVar4,8);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  lVar1 = *(long *)(local_378 + -0x18);
  _Var3 = std::operator|(_S_dec,_S_hex);
  _Var3 = std::operator|(_Var3,_S_oct);
  std::ios_base::unsetf((ios_base *)((long)&local_378 + lVar1),_Var3);
  std::istream::operator>>(&local_378,&this->scopeid);
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_378);
  return;
}

Assistant:

void SleighSymbol::restoreXmlHeader(const Element *el)

{
  name = el->getAttributeValue("name");
  {
    istringstream s(el->getAttributeValue("id"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> id;
  }
  {
    istringstream s(el->getAttributeValue("scope"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> scopeid;
  }
}